

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

bool __thiscall r_exec::Group::invalidate(Group *this)

{
  bool bVar1;
  pointer pvVar2;
  View *pVVar3;
  Group *local_50;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> guard;
  Group *group;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_20;
  const_iterator gv;
  Group *this_local;
  
  gv.super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>._M_cur
       = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
         (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)this;
  bVar1 = Object<r_code::LObject,_r_exec::LObject>::invalidate
                    ((Object<r_code::LObject,_r_exec::LObject> *)this);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&local_20);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
         ::begin(&this->group_views);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&local_28,
               (_Node_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                *)&local_30);
    local_20._M_cur = local_28._M_cur;
    while( true ) {
      group = (Group *)std::
                       unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
                       ::end(&this->group_views);
      bVar1 = std::__detail::operator!=
                        (&local_20,
                         (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                          *)&group);
      if (!bVar1) break;
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                             *)&local_20);
      pVVar3 = core::P<r_exec::View>::operator->(&pvVar2->second);
      guard._M_device =
           (mutex_type *)core::P::operator_cast_to_Group_((P *)&(pVVar3->super_View).object);
      std::lock_guard<std::mutex>::lock_guard(&local_48,&((Group *)guard._M_device)->mutex);
      local_50 = this;
      std::
      unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
      ::erase((unordered_map<r_exec::Group_*,_bool,_std::hash<r_exec::Group_*>,_std::equal_to<r_exec::Group_*>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>_>
               *)&guard._M_device[0x17].super___mutex_base._M_mutex.__data.__list,&local_50);
      std::lock_guard<std::mutex>::~lock_guard(&local_48);
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>::
      operator++((_Node_const_iterator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false,_false>
                  *)&local_20);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Group::invalidate()
{
    if (LObject::invalidate()) {
        return true;
    }

    // unregister from all groups it views.
    std::unordered_map<uint64_t, P<View> >::const_iterator gv;

    for (gv = group_views.begin(); gv != group_views.end(); ++gv) {
        Group *group = (Group *)gv->second->object;
        std::lock_guard<std::mutex> guard(group->mutex);
        group->viewing_groups.erase(this);
    }

    /* We keep the group intact: the only thing is now the group will not be updated anymore.
    // remove all views that are hosted by this group.
    FOR_ALL_VIEWS_BEGIN(this,v)

    v->second->object->acq_views();
    v->second->object->views.erase(v->second); // delete view from object's views.
    v->second->object->rel_views();

    FOR_ALL_VIEWS_END

    notification_views.clear();
    ipgm_views.clear();
    anti_ipgm_views.clear();
    input_less_ipgm_views.clear();
    other_views.clear();
    group_views.clear();
    */
    return false;
}